

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  double *scalar;
  PointerType pdVar1;
  PointerType pdVar2;
  RhsNested pMVar3;
  RhsNested pMVar4;
  element_type *this_00;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this_01;
  StorageBaseType *matrix;
  double dVar5;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar6;
  Map<Eigen::Matrix<double,_27,_1,_0,_27,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  VectorNIP_Dv E_BlockDamping_Dv;
  MatrixNx3 QiCompact;
  VectorNIP_Dv SPK2_3_Block_Dv;
  VectorNIP_Dv SPK2_2_Block_Dv;
  VectorNIP_Dv SPK2_1_Block_Dv;
  VectorNIP_Dv E2_Block_Dv;
  VectorNIP_Dv E1_Block_Dv;
  VectorNIP_D0 E_BlockDamping_D0;
  VectorNIP_Dv E3_Block_Dv;
  VectorNIP_D0 SPK2_5_Block_D0;
  VectorNIP_D0 SPK2_4_Block_D0;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  VectorNIP_D0 SPK2_6_Block_D0;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  VectorNIP_D0 SPK2_3_Block_D0;
  VectorNIP_D0 SPK2_2_Block_D0;
  VectorNIP_D0 SPK2_1_Block_D0;
  MatrixNx6 ebar_ebardot;
  undefined1 local_14c8 [16];
  MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *local_14b8;
  variable_if_dynamic<long,__1> local_14b0;
  variable_if_dynamic<long,__1> vStack_14a8;
  Index local_14a0;
  double local_1488;
  RhsNested local_1480;
  MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *local_1468;
  ChVectorDynamic<> *local_1460;
  __shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *local_1458;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1450 [24];
  undefined1 local_1438 [16];
  scalar_constant_op<double> local_1428;
  variable_if_dynamic<long,__1> local_1420;
  scalar_constant_op<double> local_1418;
  variable_if_dynamic<long,__1> local_1410;
  variable_if_dynamic<long,__1> vStack_1408;
  Index local_1400;
  RhsNested local_13f8;
  XprTypeNested local_13e8;
  undefined8 local_13e0;
  PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *local_13d8;
  variable_if_dynamic<long,__1> local_13d0;
  variable_if_dynamic<long,__1> local_13c8;
  scalar_constant_op<double> local_13c0;
  element_type *local_13b8;
  XprTypeNested local_13b0;
  undefined8 local_13a8;
  PointerType local_13a0;
  undefined8 local_1398;
  PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *local_1390;
  variable_if_dynamic<long,__1> local_1388;
  variable_if_dynamic<long,__1> local_1380;
  Index local_1378;
  RhsNested local_1370;
  undefined8 local_1368;
  undefined1 *local_1350;
  XprTypeNested local_1340;
  undefined8 local_1338;
  undefined8 local_1330;
  undefined8 local_1328;
  undefined1 *local_1320;
  XprTypeNested local_1310;
  undefined8 local_1308;
  undefined8 local_1300;
  undefined8 local_12f8;
  PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> local_12e0 [8];
  double local_12d8;
  double local_12d0;
  double local_12c8;
  double local_12c0;
  double local_12b8;
  double local_12b0;
  double local_12a8;
  double local_12a0;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1298 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1280 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1268 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1250 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_1238 [24];
  undefined1 local_1220 [136];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1198;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1170;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1148;
  undefined1 local_1120 [96];
  undefined1 local_10c0 [104];
  Matrix<double,_45,_3,_0,_45,_3> local_1058;
  undefined1 local_c20 [112];
  undefined1 local_bb0 [192];
  double local_af0 [12];
  undefined1 local_a90 [24];
  undefined1 local_a78 [24];
  undefined1 local_a60 [216];
  double local_988 [12];
  undefined1 local_928 [24];
  undefined1 local_910 [24];
  undefined1 local_8f8 [216];
  double local_820 [12];
  undefined1 local_7c0 [48];
  undefined1 local_790 [336];
  undefined1 local_640 [48];
  undefined1 local_610 [96];
  undefined1 local_5b0 [96];
  undefined1 local_550 [96];
  undefined1 local_4f0 [48];
  undefined1 local_4c0 [384];
  undefined1 local_340 [192];
  undefined1 local_280 [592];
  
  local_14c8._8_8_ = local_14c8._0_8_;
  local_1460 = Fi;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)(local_280 + 0x70));
  local_1468 = (MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->m_SD;
  local_1438._0_8_ = local_1468;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array.
  _0_16_ = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                     ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                      local_1438,
                      (MatrixBase<Eigen::Matrix<double,_9,_6,_1,_9,_6>_> *)(local_280 + 0x70));
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,9,6,1,9,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_9,_6,_1,_9,_6>,_0>_>
              *)&local_1058);
  local_1458 = &(this->m_material).
                super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1058,local_1458);
  dVar5 = local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data
          .array[0];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.
              m_data.array + 1));
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_610;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)(local_790 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)(local_4c0 + 0x18);
  pdVar1 = (PointerType)(local_a60 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  pdVar2 = (PointerType)(local_8f8 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_1220,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_280,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_1438._0_8_ = (element_type *)local_280;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_1438,
             (Scalar *)&local_1058);
  scalar = &this->m_Alpha;
  local_1438._0_8_ = this->m_Alpha + this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,(double *)local_1438,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_280,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  pMVar6 = &this->m_kGQ_D0;
  local_1438._0_8_ = (element_type *)local_280;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)dVar5)->m_storage).
                m_cols * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_280,(Scalar *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)(local_790 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_5b0;
  pMVar3 = (RhsNested)(local_a60 + 0x78);
  pMVar4 = (RhsNested)(local_8f8 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)(local_4c0 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1438._0_8_ = local_1220;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_1438,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  this_00 = (element_type *)(local_340 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[2];
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_1438._0_8_ = this_00;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_1438,
             (Scalar *)&local_1058);
  local_1438._0_8_ = this->m_Alpha + this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,(double *)local_1438,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)this_00,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  local_1438._0_8_ = this_00;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)(((non_const_type)((long)dVar5 + 0x18))->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data *
        0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)this_00,(Scalar *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_550;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)(local_790 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)(local_4c0 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1438._0_8_ = local_1220;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_1438,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_340,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_1438._0_8_ = (element_type *)local_340;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_1438,
             (Scalar *)&local_1058);
  local_1438._0_8_ = this->m_Alpha + this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,(double *)local_1438,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_340,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  local_1438._0_8_ = (element_type *)local_340;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)(((non_const_type)((long)dVar5 + 0x18))->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows *
        0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_340,(Scalar *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [9] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = (double)(local_790 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xe] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = (double)local_5b0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1b] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = (double)(local_4c0 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x29] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2e] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x34] = (double)(local_790 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x31] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x42] = (double)local_550;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3f] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x50] = (double)(local_4c0 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4d] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_1438._0_8_ = (element_type *)local_1220;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x30] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x36] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3c] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3e] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x44] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4a] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4c] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x52] = (double)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_1438,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_10c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,scalar,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_10c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  local_1438._0_8_ = (element_type *)local_10c0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_10c0,
             (Scalar *)
             &(((non_const_type)((long)dVar5 + 0x18))->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [9] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = (double)(local_790 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = (double)local_610;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = (double)(local_4c0 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x34] = (double)(local_790 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x42] = (double)local_550;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x50] = (double)(local_4c0 + 0xd8);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_1438._0_8_ = local_1220;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2e] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x30] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x36] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3c] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3e] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x44] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4a] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4c] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x52] = (double)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_1438,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)local_af0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)local_988;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)local_820;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_1120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,scalar,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_1120,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  local_1438._0_8_ = (element_type *)local_1120;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_1120,
             (Scalar *)((long)dVar5 + 0x30));
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = (double)(local_790 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [9] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = (double)local_610;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = (double)(local_4c0 + 0x18);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x34] = (double)(local_790 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x37] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x42] = (double)local_5b0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x45] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x50] = (double)(local_4c0 + 0x78);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x53] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_1438._0_8_ = local_1220;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x2e] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x30] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x36] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3c] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x3e] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x44] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4a] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x4c] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x52] = (double)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_1438,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [8] = (double)(local_bb0 + 0x60);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [2] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [4] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [10] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0xf] = (double)pdVar1;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x11] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x15] = (double)pMVar3;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x17] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1d] = (double)pdVar2;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x1f] = (double)local_bb0;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x23] = (double)pMVar4;
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0x25] = (double)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_c20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_1058);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_1058,scalar,(StorageBaseType *)local_1220);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_c20,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_1058);
  local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array
  [0] = (double)pMVar6;
  local_1438._0_8_ = (element_type *)local_c20;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_1438,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_1058);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_c20,
             (Scalar *)
             &(((non_const_type)((long)dVar5 + 0x30))->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows);
  local_13e8 = (XprTypeNested)(local_bb0 + 0x60);
  local_1410.m_value = 0;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 0;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1388.m_value = 0x18;
  local_1380.m_value = 0;
  local_1370 = (RhsNested)local_1120;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14b0.m_value = 0;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_280;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13b8 = (element_type *)local_c20;
  local_13a0 = local_af0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_14c8._0_8_ = local_14b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1410.m_value = 0;
  vStack_1408.m_value = 1;
  local_1400 = 0x2d;
  local_13b8 = (element_type *)local_c20;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 1;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1370 = (RhsNested)local_1120;
  local_1388.m_value = 0x18;
  local_1380.m_value = 1;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x2d;
  local_14b0.m_value = 0;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)pdVar1;
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_280;
  local_13e8 = (XprTypeNested)pMVar3;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13a0 = local_988;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1410.m_value = 0;
  local_13f8 = (RhsNested)local_280;
  vStack_1408.m_value = 2;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 2;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1370 = (RhsNested)local_1120;
  local_1388.m_value = 0x18;
  local_1380.m_value = 2;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x5a;
  local_14b0.m_value = 0;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)pdVar2;
  local_1418.m_other = (double)local_bb0;
  local_13e8 = (XprTypeNested)pMVar4;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13b8 = (element_type *)local_c20;
  local_13a0 = local_820;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_13e8 = (XprTypeNested)(local_bb0 + 0x60);
  local_1410.m_value = 0;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 0;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1370 = (RhsNested)local_10c0;
  local_1388.m_value = 0x18;
  local_1380.m_value = 0;
  local_1378 = 0x2d;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0xc;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14b0.m_value = 0xc;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_c20;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13b8 = (element_type *)(local_340 + 0x60);
  local_13a0 = local_af0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1410.m_value = 0;
  local_13f8 = (RhsNested)local_c20;
  vStack_1408.m_value = 1;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 1;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1370 = (RhsNested)local_10c0;
  local_1388.m_value = 0x18;
  local_1380.m_value = 1;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x39;
  local_14b0.m_value = 0xc;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)pdVar1;
  local_1418.m_other = (double)local_bb0;
  local_13e8 = (XprTypeNested)pMVar3;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13b8 = (element_type *)(local_340 + 0x60);
  local_13a0 = local_988;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1410.m_value = 0;
  local_13f8 = (RhsNested)local_c20;
  vStack_1408.m_value = 2;
  local_1400 = 0x2d;
  local_13b8 = (element_type *)(local_340 + 0x60);
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 2;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1370 = (RhsNested)local_10c0;
  local_1388.m_value = 0x18;
  local_1380.m_value = 2;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x66;
  local_14b0.m_value = 0xc;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)pdVar2;
  local_1418.m_other = (double)local_bb0;
  local_13e8 = (XprTypeNested)pMVar4;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13a0 = local_820;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_13f8 = (RhsNested)local_1120;
  local_13e8 = (XprTypeNested)(local_bb0 + 0x60);
  local_13b8 = (element_type *)local_10c0;
  local_1410.m_value = 0;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 0;
  local_13c0.m_other = 2.22329540628561e-322;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1388.m_value = 0x18;
  local_1380.m_value = 0;
  local_1378 = 0x2d;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x18;
  local_14b0.m_value = 0x18;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  local_1418.m_other = (double)local_bb0;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_13a0 = local_af0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_bb0;
  local_1370 = (RhsNested)local_340;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1418.m_other = (double)local_bb0;
  local_1410.m_value = 0;
  local_13f8 = (RhsNested)local_1120;
  vStack_1408.m_value = 1;
  local_1400 = 0x2d;
  local_13b8 = (element_type *)local_10c0;
  local_13d0.m_value = 0xc;
  local_13c8.m_value = 1;
  local_13c0.m_other = 2.22329540628561e-322;
  local_1388.m_value = 0x18;
  local_1380.m_value = 1;
  local_1378 = 0x2d;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x45;
  local_14b0.m_value = 0x18;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1428.m_other = (double)pdVar1;
  local_13e8 = (XprTypeNested)pMVar3;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_1418.m_other;
  local_13a0 = local_988;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_1418.m_other;
  local_1370 = (RhsNested)local_340;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_1418.m_other = (double)local_bb0;
  local_1410.m_value = 0;
  local_13f8 = (RhsNested)local_1120;
  vStack_1408.m_value = 2;
  local_1400 = 0x2d;
  local_13d0.m_value = 0xc;
  local_13b8 = (element_type *)local_10c0;
  local_13c8.m_value = 2;
  local_13c0.m_other = 2.22329540628561e-322;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x72;
  local_14b0.m_value = 0x18;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_1370 = (RhsNested)local_340;
  local_1388.m_value = 0x18;
  local_1380.m_value = 2;
  local_1378 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1428.m_other = (double)pdVar2;
  local_13e8 = (XprTypeNested)pMVar4;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_1418.m_other;
  local_13a0 = local_820;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_1418.m_other;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)local_1438);
  local_13f8 = (RhsNested)(local_790 + 0x138);
  local_1418.m_other = (double)local_bb0;
  local_13c0.m_other = (double)local_928;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_4f0;
  local_1410.m_value = 0x24;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_1350 = local_7c0;
  local_13e0 = 0x24;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x3;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x24;
  local_13a0 = (PointerType)0x1;
  local_1320 = local_4c0 + 0x138;
  local_1398 = 0x2d;
  local_1378 = 0x24;
  local_1370 = (RhsNested)0x4;
  local_1368 = 0x2d;
  local_1338 = 0x24;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x24;
  local_1300 = 5;
  local_12f8 = 0x2d;
  local_1428.m_other = (double)local_a90;
  local_13e8 = (XprTypeNested)local_1418.m_other;
  local_13b0 = (XprTypeNested)local_1418.m_other;
  local_1380.m_value = (long)local_1418.m_other;
  local_1340 = (XprTypeNested)local_1418.m_other;
  local_1310 = (XprTypeNested)local_1418.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_1450,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)local_1438);
  local_13c0.m_other = (double)local_928;
  local_1410.m_value = 0x24;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13e0 = 0x24;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x0;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x24;
  local_13a0 = (PointerType)0x1;
  local_1398 = 0x2d;
  local_1350 = local_7c0;
  local_1378 = 0x24;
  local_1370 = (RhsNested)0x1;
  local_1368 = 0x2d;
  local_1338 = 0x24;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x24;
  local_1300 = 2;
  local_12f8 = 0x2d;
  local_1428.m_other = (double)local_a90;
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_a90;
  local_13e8 = (XprTypeNested)local_bb0;
  local_13b0 = (XprTypeNested)local_bb0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_13c0.m_other;
  local_1380.m_value = (long)local_bb0;
  local_1340 = (XprTypeNested)local_bb0;
  local_1320 = local_1350;
  local_1310 = (XprTypeNested)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_1238,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)local_1438);
  local_1438._0_8_ = &DAT_3ff0000000000000;
  local_14c8._0_8_ = local_1238;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_14c8,
             (Scalar *)local_1438);
  local_1438._0_8_ = (element_type *)0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1238,(Scalar *)local_1438);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_1438,scalar,(StorageBaseType *)local_1450);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1238,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1438);
  pMVar6 = &this->m_kGQ_Dv;
  local_1438._0_8_ = pMVar6;
  local_14c8._0_8_ = local_1238;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_14c8,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_1438);
  local_13f8 = (RhsNested)local_640;
  local_13c0.m_other = (double)local_910;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)(local_4f0 + 0x18);
  local_1410.m_value = 0x27;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_1350 = local_7c0 + 0x18;
  local_13e0 = 0x27;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x3;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x27;
  local_13a0 = (PointerType)0x1;
  local_1320 = local_4c0 + 0x150;
  local_1398 = 0x2d;
  local_1378 = 0x27;
  local_1370 = (RhsNested)0x4;
  local_1368 = 0x2d;
  local_1338 = 0x27;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x27;
  local_1300 = 5;
  local_12f8 = 0x2d;
  local_14c8._0_8_ = local_1450;
  local_1428.m_other = (double)local_a78;
  local_1418.m_other = (double)local_bb0;
  local_13e8 = (XprTypeNested)local_bb0;
  local_13b0 = (XprTypeNested)local_bb0;
  local_1380.m_value = (long)local_bb0;
  local_1340 = (XprTypeNested)local_bb0;
  local_1310 = (XprTypeNested)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_14c8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)local_1438);
  local_1410.m_value = 0x27;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13e0 = 0x27;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x0;
  local_13c0.m_other = (double)local_910;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x27;
  local_13a0 = (PointerType)0x1;
  local_1398 = 0x2d;
  local_1350 = local_7c0 + 0x18;
  local_1378 = 0x27;
  local_1370 = (RhsNested)0x1;
  local_1368 = 0x2d;
  local_1338 = 0x27;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x27;
  local_1300 = 2;
  local_12f8 = 0x2d;
  local_1428.m_other = (double)local_a78;
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_a78;
  local_13e8 = (XprTypeNested)local_bb0;
  local_13b0 = (XprTypeNested)local_bb0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_13c0.m_other;
  local_1380.m_value = (long)local_bb0;
  local_1340 = (XprTypeNested)local_bb0;
  local_1320 = local_1350;
  local_1310 = (XprTypeNested)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_1250,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)local_1438);
  local_1438._0_8_ = &DAT_3ff0000000000000;
  local_14c8._0_8_ = local_1250;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_14c8,
             (Scalar *)local_1438);
  local_1438._0_8_ = (element_type *)0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1250,(Scalar *)local_1438);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_1438,scalar,(StorageBaseType *)local_1450);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1250,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1438);
  local_1438._0_8_ = pMVar6;
  local_14c8._0_8_ = local_1250;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_14c8,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_1438);
  local_1428.m_other = (double)local_a60;
  local_13f8 = (RhsNested)(local_640 + 0x18);
  local_1410.m_value = 0x2a;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13c0.m_other = (double)local_8f8;
  local_13e0 = 0x2a;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x3;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_4c0;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x2a;
  local_13a0 = (PointerType)0x1;
  local_1398 = 0x2d;
  local_1378 = 0x2a;
  local_1370 = (RhsNested)0x4;
  local_1320 = local_4c0 + 0x168;
  local_1368 = 0x2d;
  local_1338 = 0x2a;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x2a;
  local_1300 = 5;
  local_12f8 = 0x2d;
  local_14c8._0_8_ = local_1450;
  local_1418.m_other = (double)local_bb0;
  local_13e8 = (XprTypeNested)local_bb0;
  local_13b0 = (XprTypeNested)local_bb0;
  local_1380.m_value = (long)local_bb0;
  local_1350 = local_790;
  local_1340 = (XprTypeNested)local_bb0;
  local_1310 = (XprTypeNested)local_bb0;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_14c8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)local_1438);
  local_1428.m_other = (double)local_a60;
  local_13c0.m_other = (double)local_8f8;
  local_1410.m_value = 0x2a;
  vStack_1408.m_value = 0;
  local_1400 = 0x2d;
  local_13e0 = 0x2a;
  local_13d8 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)0x0;
  local_13d0.m_value = 0x2d;
  local_13a8 = 0x2a;
  local_13a0 = (PointerType)0x1;
  local_1398 = 0x2d;
  local_1378 = 0x2a;
  local_1370 = (RhsNested)0x1;
  local_1368 = 0x2d;
  local_1338 = 0x2a;
  local_1330 = 2;
  local_1328 = 0x2d;
  local_1308 = 0x2a;
  local_1300 = 2;
  local_12f8 = 0x2d;
  this_01 = (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)(local_1220 + 0x70);
  local_1418.m_other = (double)local_bb0;
  local_13f8 = (RhsNested)local_1428.m_other;
  local_13e8 = (XprTypeNested)local_bb0;
  local_13b0 = (XprTypeNested)local_bb0;
  local_1390 = (PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_13c0.m_other;
  local_1380.m_value = (long)local_bb0;
  local_1350 = local_790;
  local_1340 = (XprTypeNested)local_bb0;
  local_1320 = local_790;
  local_1310 = (XprTypeNested)local_bb0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (this_01,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
                      *)local_1438);
  local_1438._0_8_ = &DAT_3ff0000000000000;
  local_14c8._0_8_ = this_01;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_14c8,
             (Scalar *)local_1438);
  local_1438._0_8_ = (element_type *)0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_01,(Scalar *)local_1438);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_1438,scalar,(StorageBaseType *)local_1450);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_01,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_1438);
  local_1438._0_8_ = pMVar6;
  local_14c8._0_8_ = this_01;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_14c8,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             local_1438);
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_1438
             ,local_1458);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Matrix<double,3,3,1,3,3>>
            (local_12e0,
             (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)(local_1438._0_8_ + 0x40));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1438 + 8));
  Eigen::operator*(&local_1148,(double *)local_12e0,(StorageBaseType *)local_1238);
  Eigen::operator*(&local_1170,&local_12d8,(StorageBaseType *)local_1250);
  matrix = (StorageBaseType *)(local_1220 + 0x70);
  local_14b0.m_value = (long)local_1148.m_lhs.m_functor.m_other;
  vStack_14a8.m_value = (long)local_1148.m_rhs;
  local_1488 = local_1170.m_lhs.m_functor.m_other;
  local_1480 = local_1170.m_rhs;
  Eigen::operator*(&local_1198,&local_12d0,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_1438,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_14c8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_1198);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_1268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1438);
  Eigen::operator*(&local_1148,&local_12c8,(StorageBaseType *)local_1238);
  Eigen::operator*(&local_1170,&local_12c0,(StorageBaseType *)local_1250);
  local_14b0.m_value = (long)local_1148.m_lhs.m_functor.m_other;
  vStack_14a8.m_value = (long)local_1148.m_rhs;
  local_1488 = local_1170.m_lhs.m_functor.m_other;
  local_1480 = local_1170.m_rhs;
  Eigen::operator*(&local_1198,&local_12b8,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_1438,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_14c8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_1198);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_1280,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1438);
  Eigen::operator*(&local_1148,&local_12b0,(StorageBaseType *)local_1238);
  Eigen::operator*(&local_1170,&local_12a8,(StorageBaseType *)local_1250);
  local_14b0.m_value = (long)local_1148.m_lhs.m_functor.m_other;
  vStack_14a8.m_value = (long)local_1148.m_rhs;
  local_1488 = local_1170.m_lhs.m_functor.m_other;
  local_1480 = local_1170.m_rhs;
  Eigen::operator*(&local_1198,&local_12a0,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_1438,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_14c8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_1198);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_1298,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)local_1438);
  local_1438._0_8_ = local_a90;
  local_1428.m_other = (double)local_bb0;
  local_1420.m_value = 0x24;
  local_1418.m_other = 0.0;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x24;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x24;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  vStack_1408.m_value = (long)local_1268;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_928;
  local_1420.m_value = 0x24;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x51;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1418.m_other = 4.94065645841247e-324;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x24;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  vStack_1408.m_value = (long)local_1268;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_7c0;
  local_1420.m_value = 0x24;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x7e;
  vStack_1408.m_value = (long)local_1268;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1418.m_other = 9.88131291682493e-324;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x24;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_a78;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x27;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1420.m_value = 0x27;
  local_1418.m_other = 0.0;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x27;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  vStack_1408.m_value = (long)local_1280;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_910;
  local_1428.m_other = (double)local_bb0;
  local_1420.m_value = 0x27;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x54;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1418.m_other = 4.94065645841247e-324;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x27;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  vStack_1408.m_value = (long)local_1280;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_7c0 + 0x18;
  local_1420.m_value = 0x27;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x81;
  vStack_1408.m_value = (long)local_1280;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1418.m_other = 9.88131291682493e-324;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x27;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_a60;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x2a;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  local_1420.m_value = 0x2a;
  local_1418.m_other = 0.0;
  local_1410.m_value = 0x2d;
  local_14b0.m_value = 0x2a;
  vStack_14a8.m_value = 0;
  local_14a0 = 0x2d;
  local_1428.m_other = (double)local_bb0;
  vStack_1408.m_value = (long)local_1298;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_8f8;
  local_1428.m_other = (double)local_bb0;
  local_1420.m_value = 0x2a;
  local_1418.m_other = 4.94065645841247e-324;
  local_1410.m_value = 0x2d;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x57;
  local_14b0.m_value = 0x2a;
  vStack_14a8.m_value = 1;
  local_14a0 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  vStack_1408.m_value = (long)local_1298;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_1438._0_8_ = local_790;
  local_1428.m_other = (double)local_bb0;
  local_1420.m_value = 0x2a;
  vStack_1408.m_value = (long)local_1298;
  local_1418.m_other = 9.88131291682493e-324;
  local_1410.m_value = 0x2d;
  local_14c8._0_8_ =
       local_1058.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
       array + 0x84;
  local_14b0.m_value = 0x2a;
  vStack_14a8.m_value = 2;
  local_14a0 = 0x2d;
  local_14b8 = (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)local_14c8,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)local_1438);
  local_14c8 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                         (local_1468,
                          (MatrixBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_> *)&local_1058);
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,3,1,9,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,45,3,0,45,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,9,3,1,9,3>> *)local_1438,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_45,_3,_0,_45,_3>,_0>_>
              *)local_14c8);
  local_14c8._0_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
        *)local_1438;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,27,1,0,27,1>,0,Eigen::Stride<0,0>>>
            (local_1460,
             (Map<Eigen::Matrix<double,_27,_1,_0,_27,_1>,_0,_Eigen::Stride<0,_0>_> *)local_14c8);
  return;
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For this element, this is likely more efficient than the "Pre-Integration" style calculation method.  Note that
    // the integrand for the generalize internal force vector for a straight and normalized element is of order : 8 in
    // xi, 4 in eta, and 4 in zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and
    // zeta directions for "Full Integration". However, very similar results can be obtained with fewer GQ point in each
    // direction, resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff can be calculated by
    // simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding diagonal entry
    // in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Block entries will be calculated separately in a later step.
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that with the material assumption being used, only [E11,E22,E33] need to be calculated
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 Block entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}